

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O2

void __thiscall
PKCS12Test_TestNullPassword_Test::PKCS12Test_TestNullPassword_Test
          (PKCS12Test_TestNullPassword_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0068ab78;
  return;
}

Assistant:

TEST(PKCS12Test, TestNullPassword) {
  // Generated with
  //   openssl pkcs12 -export -inkey ecdsa_p256_key.pem -in ecdsa_p256_cert.pem -password pass:
  // But with OpenSSL patched to pass NULL into PKCS12_create and
  // PKCS12_set_mac.
  std::string data = GetTestData("crypto/pkcs8/test/null_password.p12");
  TestImpl("NullPassword (empty password)", bssl::StringAsBytes(data), "",
           nullptr);
  TestImpl("NullPassword (null password)", bssl::StringAsBytes(data), nullptr,
           nullptr);
}